

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O3

int SSL_set_handshake_hints(SSL *ssl,uint8_t *hints,size_t hints_len)

{
  void *__src;
  uint8_t *puVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int line;
  ptrdiff_t _Num_12;
  Array<unsigned_char> *pAVar5;
  pointer __p;
  _Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false> _Var6;
  ptrdiff_t _Num;
  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj;
  uint64_t group_id;
  CBS secret;
  CBS ciphertext;
  CBS seq;
  int has_ticket;
  int has_psk;
  int has_ecdhe;
  int has_server_random_tls12;
  int has_cert_compression;
  int has_signature_hint;
  int has_key_share;
  int has_server_random_tls13;
  uint64_t sig_alg;
  CBS signature_hint;
  CBS ecdhe;
  CBS cert_compression;
  CBS key_share;
  CBS ticket;
  CBS server_random_tls12;
  CBS psk;
  CBS server_random_tls13;
  CBS cbs;
  _Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false> local_128;
  CBS local_120;
  CBS local_110;
  CBS local_100;
  CBS local_f0;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  uint16_t local_c0;
  undefined6 uStack_be;
  CBS local_b8;
  CBS local_a8;
  CBS local_98;
  CBS local_88;
  CBS local_78;
  CBS local_68;
  CBS local_58;
  CBS local_48;
  CBS local_38;
  
  iVar4 = SSL_is_dtls(ssl);
  if (iVar4 != 0) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                  ,0x405);
    return 0;
  }
  local_128._M_head_impl = (SSL_HANDSHAKE_HINTS *)OPENSSL_malloc(0xf8);
  if (local_128._M_head_impl == (pointer)0x0) {
    local_128._M_head_impl = (pointer)0x0;
LAB_0013f257:
    iVar4 = 0;
    goto LAB_0013f259;
  }
  memset(local_128._M_head_impl,0,0xf8);
  local_38.data = hints;
  local_38.len = hints_len;
  iVar4 = CBS_get_asn1(&local_38,&local_f0,0x20000010);
  line = 0x427;
  if ((((((iVar4 == 0) ||
         (iVar4 = CBS_get_optional_asn1(&local_f0,&local_48,&local_c4,0x80000000), iVar4 == 0)) ||
        (iVar4 = CBS_get_optional_asn1(&local_f0,&local_88,&local_c8,0xa0000001), iVar4 == 0)) ||
       ((iVar4 = CBS_get_optional_asn1(&local_f0,&local_b8,&local_cc,0xa0000002), iVar4 == 0 ||
        (iVar4 = CBS_get_optional_asn1(&local_f0,&local_58,&local_dc,0x80000003), iVar4 == 0)))) ||
      (bVar3 = get_optional_implicit_null
                         (&local_f0,&(local_128._M_head_impl)->ignore_psk,0x80000004), !bVar3)) ||
     (((iVar4 = CBS_get_optional_asn1(&local_f0,&local_98,&local_d0,0x80000005), iVar4 == 0 ||
       (iVar4 = CBS_get_optional_asn1(&local_f0,&local_68,&local_d4,0x80000006), iVar4 == 0)) ||
      ((iVar4 = CBS_get_optional_asn1(&local_f0,&local_a8,&local_d8,0x20000007), iVar4 == 0 ||
       (((iVar4 = CBS_get_optional_asn1(&local_f0,&local_78,&local_e0,0x80000008), iVar4 == 0 ||
         (bVar3 = get_optional_implicit_null
                            (&local_f0,&(local_128._M_head_impl)->renew_ticket,0x80000009), !bVar3))
        || (bVar3 = get_optional_implicit_null
                              (&local_f0,&(local_128._M_head_impl)->ignore_ticket,0x8000000a),
           !bVar3)))))))) {
LAB_0013f230:
    iVar4 = 0;
    ERR_put_error(0x10,0,0x13c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                  ,line);
  }
  else {
    if (local_c4 != 0) {
      pAVar5 = &(local_128._M_head_impl)->server_random_tls13;
      bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_48.len);
      if (bVar3 && local_48.len != 0) {
        memmove(pAVar5->data_,local_48.data,local_48.len);
      }
      if (!bVar3) goto LAB_0013f257;
    }
    if (local_c8 != 0) {
      iVar4 = CBS_get_asn1_uint64(&local_88,(uint64_t *)&local_120);
      if (((iVar4 != 0) &&
          (0xffffffffffff0000 < CONCAT62(local_120.data._2_6_,(uint16_t)local_120.data) - 0x10000U))
         && (iVar4 = CBS_get_asn1(&local_88,&local_100,4), sVar2 = local_100.len,
            puVar1 = local_100.data, iVar4 != 0)) {
        pAVar5 = &(local_128._M_head_impl)->key_share_ciphertext;
        bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_100.len);
        if (bVar3 && sVar2 != 0) {
          memmove(pAVar5->data_,puVar1,sVar2);
        }
        if ((bVar3) &&
           (iVar4 = CBS_get_asn1(&local_88,&local_110,4), sVar2 = local_110.len,
           puVar1 = local_110.data, iVar4 != 0)) {
          pAVar5 = &(local_128._M_head_impl)->key_share_secret;
          bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_110.len);
          if (bVar3 && sVar2 != 0) {
            memmove(pAVar5->data_,puVar1,sVar2);
          }
          if (bVar3) {
            (local_128._M_head_impl)->key_share_group_id = (uint16_t)local_120.data;
            goto LAB_0013f04f;
          }
        }
      }
      iVar4 = 0;
      ERR_put_error(0x10,0,0x13c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                    ,0x439);
      goto LAB_0013f259;
    }
LAB_0013f04f:
    if (local_cc != 0) {
      iVar4 = CBS_get_asn1_uint64(&local_b8,(uint64_t *)&local_c0);
      if (((iVar4 != 0) && (0xffffffffffff0000 < CONCAT62(uStack_be,local_c0) - 0x10000U)) &&
         (iVar4 = CBS_get_asn1(&local_b8,&local_100,4), sVar2 = local_100.len,
         puVar1 = local_100.data, iVar4 != 0)) {
        pAVar5 = &(local_128._M_head_impl)->signature_input;
        bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_100.len);
        if (bVar3 && sVar2 != 0) {
          memmove(pAVar5->data_,puVar1,sVar2);
        }
        if ((bVar3) &&
           (iVar4 = CBS_get_asn1(&local_b8,&local_110,4), sVar2 = local_110.len,
           puVar1 = local_110.data, iVar4 != 0)) {
          pAVar5 = &(local_128._M_head_impl)->signature_spki;
          bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_110.len);
          if (bVar3 && sVar2 != 0) {
            memmove(pAVar5->data_,puVar1,sVar2);
          }
          if ((bVar3) && (iVar4 = CBS_get_asn1(&local_b8,&local_120,4), iVar4 != 0)) {
            __src = (void *)CONCAT62(local_120.data._2_6_,(uint16_t)local_120.data);
            pAVar5 = &(local_128._M_head_impl)->signature;
            bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_120.len);
            if (bVar3 && local_120.len != 0) {
              memmove(pAVar5->data_,__src,local_120.len);
            }
            if (bVar3) {
              (local_128._M_head_impl)->signature_algorithm = local_c0;
              goto LAB_0013f1bc;
            }
          }
        }
      }
      iVar4 = 0;
      ERR_put_error(0x10,0,0x13c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                    ,0x44a);
      goto LAB_0013f259;
    }
LAB_0013f1bc:
    if (local_dc != 0) {
      pAVar5 = &(local_128._M_head_impl)->decrypted_psk;
      bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_58.len);
      if (bVar3 && local_58.len != 0) {
        memmove(pAVar5->data_,local_58.data,local_58.len);
      }
      if (!bVar3) goto LAB_0013f257;
      if ((local_dc != 0) && (line = 0x454, (local_128._M_head_impl)->ignore_psk != false))
      goto LAB_0013f230;
    }
    if (local_d0 != 0) {
      iVar4 = CBS_get_asn1_uint64(&local_98,(uint64_t *)&local_120);
      if (((iVar4 != 0) &&
          (0xffffffffffff0000 < CONCAT62(local_120.data._2_6_,(uint16_t)local_120.data) - 0x10000U))
         && (iVar4 = CBS_get_asn1(&local_98,&local_100,4), sVar2 = local_100.len,
            puVar1 = local_100.data, iVar4 != 0)) {
        pAVar5 = &(local_128._M_head_impl)->cert_compression_input;
        bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_100.len);
        if (bVar3 && sVar2 != 0) {
          memmove(pAVar5->data_,puVar1,sVar2);
        }
        if ((bVar3) &&
           (iVar4 = CBS_get_asn1(&local_98,&local_110,4), sVar2 = local_110.len,
           puVar1 = local_110.data, iVar4 != 0)) {
          pAVar5 = &(local_128._M_head_impl)->cert_compression_output;
          bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_110.len);
          if (bVar3 && sVar2 != 0) {
            memmove(pAVar5->data_,puVar1,sVar2);
          }
          if (bVar3) {
            (local_128._M_head_impl)->cert_compression_alg_id = (uint16_t)local_120.data;
            goto LAB_0013f3d2;
          }
        }
      }
      iVar4 = 0;
      ERR_put_error(0x10,0,0x13c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                    ,0x461);
      goto LAB_0013f259;
    }
LAB_0013f3d2:
    _Var6._M_head_impl = local_128._M_head_impl;
    if (local_d4 != 0) {
      bVar3 = bssl::Array<unsigned_char>::InitUninitialized
                        (&(local_128._M_head_impl)->server_random_tls12,local_68.len);
      if (bVar3 && local_68.len != 0) {
        memmove(((_Var6._M_head_impl)->server_random_tls12).data_,local_68.data,local_68.len);
      }
      if (!bVar3) goto LAB_0013f257;
    }
    if (local_d8 != 0) {
      iVar4 = CBS_get_asn1_uint64(&local_a8,(uint64_t *)&local_120);
      if (((iVar4 != 0) &&
          (0xffffffffffff0000 < CONCAT62(local_120.data._2_6_,(uint16_t)local_120.data) - 0x10000U))
         && (iVar4 = CBS_get_asn1(&local_a8,&local_100,4), iVar4 != 0)) {
        pAVar5 = &(local_128._M_head_impl)->ecdhe_public_key;
        bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_100.len);
        if (bVar3 && local_100.len != 0) {
          memmove(pAVar5->data_,local_100.data,local_100.len);
        }
        if ((bVar3) && (iVar4 = CBS_get_asn1(&local_a8,&local_110,4), iVar4 != 0)) {
          pAVar5 = &(local_128._M_head_impl)->ecdhe_private_key;
          bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_110.len);
          if (bVar3 && local_110.len != 0) {
            memmove(pAVar5->data_,local_110.data,local_110.len);
          }
          if (bVar3) {
            (local_128._M_head_impl)->ecdhe_group_id = (uint16_t)local_120.data;
            goto LAB_0013f585;
          }
        }
      }
      iVar4 = 0;
      ERR_put_error(0x10,0,0x13c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handoff.cc"
                    ,0x475);
      goto LAB_0013f259;
    }
LAB_0013f585:
    if (local_e0 == 0) {
LAB_0013f5f6:
      line = 0x483;
      _Var6._M_head_impl = local_128._M_head_impl;
      if ((local_128._M_head_impl)->renew_ticket == true) goto LAB_0013f230;
    }
    else {
      pAVar5 = &(local_128._M_head_impl)->decrypted_ticket;
      bVar3 = bssl::Array<unsigned_char>::InitUninitialized(pAVar5,local_78.len);
      if (bVar3 && local_78.len != 0) {
        memmove(pAVar5->data_,local_78.data,local_78.len);
      }
      if (!bVar3) goto LAB_0013f257;
      if (local_e0 == 0) goto LAB_0013f5f6;
      line = 0x47f;
      _Var6._M_head_impl = local_128._M_head_impl;
      if ((local_128._M_head_impl)->ignore_ticket != false) goto LAB_0013f230;
    }
    local_128._M_head_impl = (pointer)0x0;
    std::__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> *)
               &((ssl->s3->hs)._M_t.
                 super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->hints,
               _Var6._M_head_impl);
    iVar4 = 1;
  }
LAB_0013f259:
  std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter> *)&local_128);
  return iVar4;
}

Assistant:

int SSL_set_handshake_hints(SSL *ssl, const uint8_t *hints, size_t hints_len) {
  if (SSL_is_dtls(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  UniquePtr<SSL_HANDSHAKE_HINTS> hints_obj = MakeUnique<SSL_HANDSHAKE_HINTS>();
  if (hints_obj == nullptr) {
    return 0;
  }

  CBS cbs, seq, server_random_tls13, key_share, signature_hint, psk,
      cert_compression, server_random_tls12, ecdhe, ticket;
  int has_server_random_tls13, has_key_share, has_signature_hint, has_psk,
      has_cert_compression, has_server_random_tls12, has_ecdhe, has_ticket;
  CBS_init(&cbs, hints, hints_len);
  if (!CBS_get_asn1(&cbs, &seq, CBS_ASN1_SEQUENCE) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls13,
                             &has_server_random_tls13, kServerRandomTLS13Tag) ||
      !CBS_get_optional_asn1(&seq, &key_share, &has_key_share,
                             kKeyShareHintTag) ||
      !CBS_get_optional_asn1(&seq, &signature_hint, &has_signature_hint,
                             kSignatureHintTag) ||
      !CBS_get_optional_asn1(&seq, &psk, &has_psk, kDecryptedPSKTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_psk,
                                  kIgnorePSKTag) ||
      !CBS_get_optional_asn1(&seq, &cert_compression, &has_cert_compression,
                             kCompressCertificateTag) ||
      !CBS_get_optional_asn1(&seq, &server_random_tls12,
                             &has_server_random_tls12, kServerRandomTLS12Tag) ||
      !CBS_get_optional_asn1(&seq, &ecdhe, &has_ecdhe, kECDHEHintTag) ||
      !CBS_get_optional_asn1(&seq, &ticket, &has_ticket, kDecryptedTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->renew_ticket,
                                  kRenewTicketTag) ||
      !get_optional_implicit_null(&seq, &hints_obj->ignore_ticket,
                                  kIgnoreTicketTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_server_random_tls13 &&
      !hints_obj->server_random_tls13.CopyFrom(server_random_tls13)) {
    return 0;
  }

  if (has_key_share) {
    uint64_t group_id;
    CBS ciphertext, secret;
    if (!CBS_get_asn1_uint64(&key_share, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&key_share, &ciphertext, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_ciphertext.CopyFrom(ciphertext) ||
        !CBS_get_asn1(&key_share, &secret, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->key_share_secret.CopyFrom(secret)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->key_share_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_signature_hint) {
    uint64_t sig_alg;
    CBS input, spki, signature;
    if (!CBS_get_asn1_uint64(&signature_hint, &sig_alg) ||  //
        sig_alg == 0 || sig_alg > 0xffff ||
        !CBS_get_asn1(&signature_hint, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_input.CopyFrom(input) ||
        !CBS_get_asn1(&signature_hint, &spki, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature_spki.CopyFrom(spki) ||
        !CBS_get_asn1(&signature_hint, &signature, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->signature.CopyFrom(signature)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->signature_algorithm = static_cast<uint16_t>(sig_alg);
  }

  if (has_psk && !hints_obj->decrypted_psk.CopyFrom(psk)) {
    return 0;
  }
  if (has_psk && hints_obj->ignore_psk) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  if (has_cert_compression) {
    uint64_t alg;
    CBS input, output;
    if (!CBS_get_asn1_uint64(&cert_compression, &alg) ||  //
        alg == 0 || alg > 0xffff ||
        !CBS_get_asn1(&cert_compression, &input, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_input.CopyFrom(input) ||
        !CBS_get_asn1(&cert_compression, &output, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->cert_compression_output.CopyFrom(output)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->cert_compression_alg_id = static_cast<uint16_t>(alg);
  }

  if (has_server_random_tls12 &&
      !hints_obj->server_random_tls12.CopyFrom(server_random_tls12)) {
    return 0;
  }

  if (has_ecdhe) {
    uint64_t group_id;
    CBS public_key, private_key;
    if (!CBS_get_asn1_uint64(&ecdhe, &group_id) ||  //
        group_id == 0 || group_id > 0xffff ||
        !CBS_get_asn1(&ecdhe, &public_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_public_key.CopyFrom(public_key) ||
        !CBS_get_asn1(&ecdhe, &private_key, CBS_ASN1_OCTETSTRING) ||
        !hints_obj->ecdhe_private_key.CopyFrom(private_key)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
      return 0;
    }
    hints_obj->ecdhe_group_id = static_cast<uint16_t>(group_id);
  }

  if (has_ticket && !hints_obj->decrypted_ticket.CopyFrom(ticket)) {
    return 0;
  }
  if (has_ticket && hints_obj->ignore_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }
  if (!has_ticket && hints_obj->renew_ticket) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_COULD_NOT_PARSE_HINTS);
    return 0;
  }

  ssl->s3->hs->hints = std::move(hints_obj);
  return 1;
}